

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<DataStream,std::vector<unsigned_char,std::allocator<unsigned_char>>,unsigned_int,unsigned_int,unsigned_char>
               (DataStream *s,vector<unsigned_char,_std::allocator<unsigned_char>_> *args,
               uint *args_1,uint *args_2,uchar *args_3)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  DataStream *in_RSI;
  long in_FS_OFFSET;
  DataStream *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(in_RSI,in_RDX);
  Serialize<DataStream>(in_stack_ffffffffffffffc8,0);
  Serialize<DataStream>(in_stack_ffffffffffffffc8,0);
  Serialize<DataStream>(in_stack_ffffffffffffffc8,'\0');
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}